

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O1

Expr __thiscall
mp::internal::NLReader<mp::internal::TextReader<fmt::Locale>,_VarCounter>::ReadSymbolicExpr
          (NLReader<mp::internal::TextReader<fmt::Locale>,_VarCounter> *this)

{
  char code;
  TextReader<fmt::Locale> *this_00;
  char *pcVar1;
  bool bVar2;
  int opcode;
  NumericExpr NVar3;
  NumericExpr unaff_EBP;
  
  bVar2 = false;
  do {
    this_00 = this->reader_;
    pcVar1 = (this_00->super_ReaderBase).ptr_;
    (this_00->super_ReaderBase).token_ = pcVar1;
    (this_00->super_ReaderBase).ptr_ = pcVar1 + 1;
    code = *pcVar1;
    if (code != 'o') {
      if (code == 'h') {
        TextReader<fmt::Locale>::ReadString(this_00);
        NVar3 = 0;
      }
      else {
        NVar3 = ReadNumericExpr(this,code,false);
      }
LAB_001d3675:
      if (bVar2) {
        NVar3 = unaff_EBP;
      }
      return NVar3;
    }
    opcode = ReadOpCode(this);
    if (opcode != 0x41) {
      NVar3 = ReadNumericExpr(this,opcode);
      goto LAB_001d3675;
    }
    ReadLogicalExpr(this);
    ReadSymbolicExpr(this);
    if (!bVar2) {
      unaff_EBP = 0;
    }
    bVar2 = true;
  } while( true );
}

Assistant:

typename Handler::Expr NLReader<Reader, Handler>::ReadSymbolicExpr() {
  char c = reader_.ReadChar();
  switch (c) {
  case 'h':
    return handler_.OnString(reader_.ReadString());
  case 'o': {
    int opcode = ReadOpCode();
    if (opcode != expr::nl_opcode(expr::IFSYM))
      return ReadNumericExpr(opcode);
    // Read symbolic if expression.
    LogicalExpr condition = ReadLogicalExpr();
    Expr then_expr = ReadSymbolicExpr();
    Expr else_expr = ReadSymbolicExpr();
    return handler_.OnSymbolicIf(condition, then_expr, else_expr);
  }
  }
  return ReadNumericExpr(c, false);
}